

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall google::protobuf::internal::SooRep::set_size(SooRep *this,bool is_soo,int size)

{
  ulong uVar1;
  Nonnull<const_char_*> pcVar2;
  
  uVar1 = (this->field_0).long_rep.elements_int;
  if (((uVar1 & 4) == 0) == is_soo) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (is_soo,(uVar1 & 4) == 0,"is_soo == this->is_soo()");
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    if (is_soo) {
      if (size < 4) {
        pcVar2 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           ((ulong)(uint)size,3,"size <= kSooSizeMask");
      }
      if (pcVar2 != (Nonnull<const_char_*>)0x0) goto LAB_0052b179;
      (this->field_0).long_rep.elements_int =
           (long)size | (this->field_0).long_rep.elements_int & 0xfffffffffffffff8;
    }
    else {
      (this->field_0).long_rep.size = size;
    }
    return;
  }
  set_size();
LAB_0052b179:
  set_size();
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_EQ(is_soo, this->is_soo());
    if (is_soo) {
      ABSL_DCHECK_LE(size, kSooSizeMask);
      short_rep.arena_and_size &= kSooPtrMask;
      short_rep.arena_and_size |= size;
    } else {
      long_rep.size = size;
    }
  }